

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *protopath;
  char *__s1;
  char *parampath;
  char *binpath;
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  int *piVar6;
  void *in_R8;
  bool bVar7;
  FILE *__stream;
  mapped_type local_328;
  FILE *local_2e0;
  vector<float,_std::allocator<float>_> scales;
  float scale;
  pointer local_2b0;
  int *local_2a8;
  undefined8 local_2a0;
  undefined4 local_298;
  long *local_290;
  undefined4 local_288;
  int local_284;
  undefined8 local_280;
  undefined4 local_278;
  long local_270;
  vector<char,_std::allocator<char>_> line;
  string key_str;
  NetQuantize quantizer;
  char key [256];
  
  if (argc != 6) {
    fprintf(_stderr,"usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n",*argv);
    return -1;
  }
  protopath = argv[1];
  __s1 = argv[2];
  parampath = argv[3];
  binpath = argv[4];
  pcVar3 = argv[5];
  NetQuantize::NetQuantize(&quantizer);
  if (pcVar3 != (char *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&quantizer.blob_int8scale_table._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&quantizer.weight_int8scale_table._M_t);
    local_2e0 = fopen(pcVar3,"rb");
    if (local_2e0 == (FILE *)0x0) {
      fprintf(_stderr,"Open %s failed.\n",pcVar3);
      fwrite("read_int8scale_table failed\n",0x1c,1,_stderr);
      iVar2 = -1;
      goto LAB_001654b2;
    }
    key_str._M_dataplus._M_p = (pointer)&key_str.field_2;
    key_str._M_string_length = 0;
    key_str.field_2._M_local_buf[0] = '\0';
    scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<char,_std::allocator<char>_>::vector(&line,0x9c4000,(allocator_type *)key);
    __stream = local_2e0;
    while ((iVar2 = feof(__stream), iVar2 == 0 &&
           (pcVar3 = fgets(line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (int)line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                           (int)line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,__stream),
           pcVar1 = line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start, pcVar3 != (char *)0x0))) {
      scale = 1.0;
      sVar4 = strcspn(line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,"\r\n");
      pcVar1[sVar4] = '\0';
      pcVar3 = strtok(line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start," ");
      __stream = local_2e0;
      if (pcVar3 == (char *)0x0) break;
      bVar7 = true;
      while (pcVar3 != (char *)0x0) {
        if (bVar7) {
          __isoc99_sscanf(pcVar3,"%255s",key);
          std::__cxx11::string::assign((char *)&key_str);
        }
        else {
          __isoc99_sscanf(pcVar3,"%f",&scale);
          std::vector<float,_std::allocator<float>_>::push_back(&scales,&scale);
        }
        bVar7 = false;
        pcVar3 = strtok((char *)0x0," ");
      }
      pcVar3 = strstr(key_str._M_dataplus._M_p,"_param_");
      if (pcVar3 == (char *)0x0) {
        local_2b0 = scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_2a8 = (int *)0x0;
        local_2a0 = 4;
        local_298 = 1;
        local_290 = (long *)0x0;
        local_284 = (int)((ulong)((long)scales.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)scales.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_280 = 0x100000001;
        local_270 = (long)local_284;
        local_288 = local_298;
        local_278 = local_298;
        ncnn::Mat::clone(&local_328,(__fn *)&local_2b0,(void *)0x0,local_284,in_R8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::operator[](&quantizer.blob_int8scale_table,&key_str);
        piVar6 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        if (pmVar5 != &local_328) {
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = pmVar5->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (pmVar5->allocator == (Allocator *)0x0) {
                free(pmVar5->data);
              }
              else {
                (*pmVar5->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pmVar5->cstep = 0;
          pmVar5->data = (void *)0x0;
          pmVar5->refcount = (int *)0x0;
          *(undefined8 *)((long)&pmVar5->refcount + 4) = 0;
          *(undefined8 *)((long)&pmVar5->elemsize + 4) = 0;
          pmVar5->dims = 0;
          pmVar5->w = 0;
          pmVar5->h = 0;
          pmVar5->d = 0;
          pmVar5->c = 0;
          pmVar5->data = local_328.data;
          piVar6 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
          pmVar5->refcount = piVar6;
          pmVar5->elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
          pmVar5->elempack = local_328.elempack;
          pmVar5->allocator = local_328.allocator;
          pmVar5->dims = local_328.dims;
          pmVar5->w = local_328.w;
          pmVar5->h = local_328.h;
          pmVar5->d = local_328.d;
          pmVar5->c = local_328.c;
          pmVar5->cstep = local_328.cstep;
        }
        __stream = local_2e0;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_328.allocator == (Allocator *)0x0) {
              free(local_328.data);
            }
            else {
              (*(local_328.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_328.cstep = 0;
        local_328.data = (void *)0x0;
        local_328.refcount._0_4_ = 0;
        local_328.refcount._4_4_ = 0;
        local_328.elemsize._0_4_ = 0;
        local_328.elemsize._4_4_ = 0;
        local_328.elempack = 0;
        local_328.c = 0;
        local_328.dims = 0;
        local_328.w = 0;
        local_328.h = 0;
        local_328.d = 0;
        if (local_2a8 != (int *)0x0) {
          LOCK();
          *local_2a8 = *local_2a8 + -1;
          UNLOCK();
          if (*local_2a8 == 0) {
            if (local_290 == (long *)0x0) goto LAB_00165373;
            (**(code **)(*local_290 + 0x18))();
          }
        }
      }
      else {
        local_2b0 = scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_2a8 = (int *)0x0;
        local_2a0 = 4;
        local_298 = 1;
        local_290 = (long *)0x0;
        local_284 = (int)((ulong)((long)scales.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)scales.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_280 = 0x100000001;
        local_270 = (long)local_284;
        local_288 = local_298;
        local_278 = local_298;
        ncnn::Mat::clone(&local_328,(__fn *)&local_2b0,(void *)0x0,local_284,in_R8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::operator[](&quantizer.weight_int8scale_table,&key_str);
        piVar6 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        if (pmVar5 != &local_328) {
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = pmVar5->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (pmVar5->allocator == (Allocator *)0x0) {
                free(pmVar5->data);
              }
              else {
                (*pmVar5->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pmVar5->cstep = 0;
          pmVar5->data = (void *)0x0;
          pmVar5->refcount = (int *)0x0;
          *(undefined8 *)((long)&pmVar5->refcount + 4) = 0;
          *(undefined8 *)((long)&pmVar5->elemsize + 4) = 0;
          pmVar5->dims = 0;
          pmVar5->w = 0;
          pmVar5->h = 0;
          pmVar5->d = 0;
          pmVar5->c = 0;
          pmVar5->data = local_328.data;
          piVar6 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
          pmVar5->refcount = piVar6;
          pmVar5->elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
          pmVar5->elempack = local_328.elempack;
          pmVar5->allocator = local_328.allocator;
          pmVar5->dims = local_328.dims;
          pmVar5->w = local_328.w;
          pmVar5->h = local_328.h;
          pmVar5->d = local_328.d;
          pmVar5->c = local_328.c;
          pmVar5->cstep = local_328.cstep;
        }
        __stream = local_2e0;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_328.allocator == (Allocator *)0x0) {
              free(local_328.data);
            }
            else {
              (*(local_328.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_328.cstep = 0;
        local_328.data = (void *)0x0;
        local_328.refcount._0_4_ = 0;
        local_328.refcount._4_4_ = 0;
        local_328.elemsize._0_4_ = 0;
        local_328.elemsize._4_4_ = 0;
        local_328.elempack = 0;
        local_328.c = 0;
        local_328.dims = 0;
        local_328.w = 0;
        local_328.h = 0;
        local_328.d = 0;
        if (local_2a8 != (int *)0x0) {
          LOCK();
          *local_2a8 = *local_2a8 + -1;
          UNLOCK();
          if (*local_2a8 == 0) {
            if (local_290 == (long *)0x0) {
LAB_00165373:
              local_328.cstep = 0;
              local_328.c = 0;
              local_328.h = 0;
              local_328.d = 0;
              local_328.dims = 0;
              local_328.w = 0;
              local_328.elempack = 0;
              local_328.elemsize._4_4_ = 0;
              local_328.elemsize._0_4_ = 0;
              local_328.refcount._4_4_ = 0;
              local_328.refcount._0_4_ = 0;
              local_328.data = (void *)0x0;
              free(local_2b0);
            }
            else {
              (**(code **)(*local_290 + 0x18))();
            }
          }
        }
      }
      key_str._M_string_length = 0;
      *key_str._M_dataplus._M_p = '\0';
      if (scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    fclose(__stream);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&line.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&scales.super__Vector_base<float,_std::allocator<float>_>);
    std::__cxx11::string::~string((string *)&key_str);
  }
  ncnn::Net::load_param((Net *)&quantizer,protopath);
  iVar2 = strcmp(__s1,"null");
  if (iVar2 == 0) {
    DataReaderFromEmpty::DataReaderFromEmpty((DataReaderFromEmpty *)key);
    ncnn::Net::load_model((Net *)&quantizer,(DataReader *)key);
    quantizer.super_ModelWriter.gen_random_weight = 1;
    ncnn::DataReader::~DataReader((DataReader *)key);
  }
  else {
    ncnn::Net::load_model((Net *)&quantizer,__s1);
  }
  NetQuantize::quantize_convolution(&quantizer);
  NetQuantize::quantize_convolutiondepthwise(&quantizer);
  NetQuantize::quantize_innerproduct(&quantizer);
  NetQuantize::fuse_requantize(&quantizer);
  iVar2 = 0;
  ModelWriter::save(&quantizer.super_ModelWriter,parampath,binpath);
LAB_001654b2:
  NetQuantize::~NetQuantize(&quantizer);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n", argv[0]);
        return -1;
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    const char* int8scale_table_path = argv[5];

    NetQuantize quantizer;

    // parse the calibration scale table
    if (int8scale_table_path)
    {
        bool s2 = read_int8scale_table(int8scale_table_path, quantizer.blob_int8scale_table, quantizer.weight_int8scale_table);
        if (!s2)
        {
            fprintf(stderr, "read_int8scale_table failed\n");
            return -1;
        }
    }

    quantizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        quantizer.load_model(dr);
        quantizer.gen_random_weight = true;
    }
    else
        quantizer.load_model(inbin);

    quantizer.quantize_convolution();
    quantizer.quantize_convolutiondepthwise();
    quantizer.quantize_innerproduct();

    quantizer.fuse_requantize();

    quantizer.save(outparam, outbin);

    return 0;
}